

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# collationiterator.cpp
# Opt level: O3

void __thiscall
icu_63::CollationIterator::backwardNumSkipped
          (CollationIterator *this,int32_t n,UErrorCode *errorCode)

{
  SkippedState *this_00;
  
  this_00 = this->skipped;
  if ((this_00 != (SkippedState *)0x0) &&
     (0x1f < (ushort)(this_00->oldBuffer).fUnion.fStackFields.fLengthAndFlags)) {
    n = SkippedState::backwardNumCodePoints(this_00,n);
  }
  (*(this->super_UObject)._vptr_UObject[0xd])(this,(ulong)(uint)n,errorCode);
  if (-1 < this->numCpFwd) {
    this->numCpFwd = this->numCpFwd + n;
  }
  return;
}

Assistant:

void
CollationIterator::backwardNumSkipped(int32_t n, UErrorCode &errorCode) {
    if(skipped != NULL && !skipped->isEmpty()) {
        n = skipped->backwardNumCodePoints(n);
    }
    backwardNumCodePoints(n, errorCode);
    if(numCpFwd >= 0) { numCpFwd += n; }
}